

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_HermiteSurface::IsValid(ON_HermiteSurface *this)

{
  ON_SimpleArray<ON_3dPoint> *pOVar1;
  ON_SimpleArray<ON_3dVector> *pOVar2;
  bool bVar3;
  int i_4;
  long lVar4;
  int i_2;
  int i_3;
  long lVar5;
  int i;
  long lVar6;
  int i_1;
  
  lVar6 = 0;
  while (lVar6 < (this->m_u_parameters).m_count) {
    bVar3 = ON_IsValid((this->m_u_parameters).m_a[lVar6]);
    lVar6 = lVar6 + 1;
    if (!bVar3) {
      return false;
    }
  }
  lVar6 = 0;
  do {
    if ((this->m_v_parameters).m_count <= lVar6) {
      lVar6 = 0;
      do {
        if ((this->m_grid_points).m_count <= lVar6) {
          lVar6 = 0;
          do {
            if ((this->m_u_tangents).m_count <= lVar6) {
              lVar6 = 0;
              do {
                if ((this->m_v_tangents).m_count <= lVar6) {
                  lVar6 = 0;
                  do {
                    if ((this->m_twists).m_count <= lVar6) {
                      bVar3 = ValidateHermiteData(&this->m_u_parameters,&this->m_v_parameters,
                                                  &this->m_grid_points,&this->m_u_tangents,
                                                  &this->m_v_tangents,&this->m_twists);
                      return bVar3;
                    }
                    lVar4 = 0;
                    lVar5 = -1;
                    while( true ) {
                      pOVar2 = (this->m_twists).m_a;
                      lVar5 = lVar5 + 1;
                      if (pOVar2[lVar6].m_count <= lVar5) break;
                      bVar3 = ON_3dVector::IsUnset
                                        ((ON_3dVector *)((long)&(pOVar2[lVar6].m_a)->x + lVar4));
                      lVar4 = lVar4 + 0x18;
                      if (bVar3) {
                        return false;
                      }
                    }
                    lVar6 = lVar6 + 1;
                  } while( true );
                }
                lVar4 = 0;
                lVar5 = -1;
                while( true ) {
                  pOVar2 = (this->m_v_tangents).m_a;
                  lVar5 = lVar5 + 1;
                  if (pOVar2[lVar6].m_count <= lVar5) break;
                  bVar3 = ON_3dVector::IsUnset
                                    ((ON_3dVector *)((long)&(pOVar2[lVar6].m_a)->x + lVar4));
                  lVar4 = lVar4 + 0x18;
                  if (bVar3) {
                    return false;
                  }
                }
                lVar6 = lVar6 + 1;
              } while( true );
            }
            lVar4 = 0;
            lVar5 = -1;
            while( true ) {
              pOVar2 = (this->m_u_tangents).m_a;
              lVar5 = lVar5 + 1;
              if (pOVar2[lVar6].m_count <= lVar5) break;
              bVar3 = ON_3dVector::IsUnset((ON_3dVector *)((long)&(pOVar2[lVar6].m_a)->x + lVar4));
              lVar4 = lVar4 + 0x18;
              if (bVar3) {
                return false;
              }
            }
            lVar6 = lVar6 + 1;
          } while( true );
        }
        lVar4 = 0;
        lVar5 = -1;
        while( true ) {
          pOVar1 = (this->m_grid_points).m_a;
          lVar5 = lVar5 + 1;
          if (pOVar1[lVar6].m_count <= lVar5) break;
          bVar3 = ON_3dPoint::IsUnset((ON_3dPoint *)((long)&(pOVar1[lVar6].m_a)->x + lVar4));
          lVar4 = lVar4 + 0x18;
          if (bVar3) {
            return false;
          }
        }
        lVar6 = lVar6 + 1;
      } while( true );
    }
    bVar3 = ON_IsValid((this->m_v_parameters).m_a[lVar6]);
    lVar6 = lVar6 + 1;
  } while (bVar3);
  return false;
}

Assistant:

bool ON_HermiteSurface::IsValid() const
{
  for (int i = 0; i < m_u_parameters.Count(); i++)
  {
    if (!ON_IsValid(m_u_parameters[i]))
      return false;
  }

  for (int i = 0; i < m_v_parameters.Count(); i++)
  {
    if (!ON_IsValid(m_v_parameters[i]))
      return false;
  }

  for (int i = 0; i < m_grid_points.Count(); i++)
  {
    for (int j = 0; j < m_grid_points[i].Count(); j++)
    {
      if (m_grid_points[i][j].IsUnset())
        return false;
    }
  }

  for (int i = 0; i < m_u_tangents.Count(); i++)
  {
    for (int j = 0; j < m_u_tangents[i].Count(); j++)
    {
      if (m_u_tangents[i][j].IsUnset())
        return false;
    }
  }

  for (int i = 0; i < m_v_tangents.Count(); i++)
  {
    for (int j = 0; j < m_v_tangents[i].Count(); j++)
    {
      if (m_v_tangents[i][j].IsUnset())
        return false;
    }
  }

  for (int i = 0; i < m_twists.Count(); i++)
  {
    for (int j = 0; j < m_twists[i].Count(); j++)
    {
      if (m_twists[i][j].IsUnset())
        return false;
    }
  }
  
  return ValidateHermiteData(
    UParameters(),
    VParameters(),
    GridPoints(),
    UTangents(),
    VTangents(),
    Twists()
  );
}